

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_next(iterator *this)

{
  atomic<long> *paVar1;
  long *plVar2;
  ulong uVar3;
  version_type locked_version;
  undefined1 uVar4;
  bool bVar5;
  stack_entry *psVar6;
  node_ptr node;
  long lVar7;
  byte unaff_R12B;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_00;
  node_type type;
  int iVar8;
  undefined1 local_60 [8];
  iter_result_opt nxt;
  read_critical_section node_critical_section;
  
  while( true ) {
    if ((this->stack_).c.
        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->stack_).c.
        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      unaff_R12B = 1;
      goto LAB_0013f110;
    }
    psVar6 = top(this);
    uVar3 = (psVar6->super_iter_result).node.tagged_ptr;
    if (uVar3 == 0) {
      __assert_fail("node != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x860,
                    "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_next() [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    this_00 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
               *)(uVar3 & 0xfffffffffffffff8);
    locked_version.version = psVar6->version;
    LOCK();
    paVar1 = &(this_00->super_header_type).m_lock.read_lock_count;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>._24_8_
         = this_00;
    bVar5 = optimistic_lock::check((optimistic_lock *)this_00,locked_version);
    if (!bVar5) break;
    type = (node_type)uVar3 & (I256|I48);
    if ((uVar3 & 7) == 0) {
      pop(this);
      if (*(long *)(nxt.
                    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                    ._24_8_ + 8) < 1) {
LAB_0013f15a:
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      LOCK();
      plVar2 = (long *)(nxt.
                        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                        ._24_8_ + 8);
      lVar7 = *plVar2;
      *plVar2 = *plVar2 + -1;
      UNLOCK();
      if (locked_version.version ==
          *(version_tag_type *)
           nxt.
           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
           ._24_8_) goto LAB_0013f0ab;
      olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::try_next
                ((iterator *)(ulong)(0 < lVar7));
LAB_0013f0f5:
      iVar8 = 1;
      unaff_R12B = 0;
LAB_0013f0ba:
      nxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _M_engaged = false;
      nxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _25_7_ = 0;
    }
    else {
      detail::
      basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
      ::next((iter_result_opt *)local_60,this_00,type,(psVar6->super_iter_result).child_index);
      bVar5 = optimistic_lock::check
                        ((optimistic_lock *)
                         nxt.
                         super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                         ._24_8_,locked_version);
      uVar4 = nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
              ._M_payload._16_1_;
      if (bVar5) {
        pop(this);
        if (uVar4 == '\0') {
          if (*(long *)(nxt.
                        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                        ._24_8_ + 8) < 1) goto LAB_0013f15a;
          LOCK();
          plVar2 = (long *)(nxt.
                            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                            ._24_8_ + 8);
          lVar7 = *plVar2;
          *plVar2 = *plVar2 + -1;
          UNLOCK();
          if (locked_version.version !=
              *(version_tag_type *)
               nxt.
               super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
               ._24_8_) {
            olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::
            try_next((iterator *)(ulong)(0 < lVar7));
            goto LAB_0013f0f5;
          }
LAB_0013f0ab:
          iVar8 = 2;
          if (lVar7 < 1) {
            __assert_fail("old_value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
          }
          goto LAB_0013f0ba;
        }
        bVar5 = try_push(this,(iter_result *)local_60,
                         (read_critical_section *)
                         &nxt.
                          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                          ._M_engaged);
        iVar8 = 1;
        if (bVar5) {
          node = detail::
                 basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 ::get_child(this_00,type,
                             nxt.
                             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                             ._M_payload._M_value.node.tagged_ptr._1_1_);
          bVar5 = optimistic_lock::check
                            ((optimistic_lock *)
                             nxt.
                             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                             ._24_8_,locked_version);
          if (bVar5) {
            unaff_R12B = try_left_most_traversal
                                   (this,(olc_node_ptr)node.tagged_ptr,
                                    (read_critical_section *)
                                    &nxt.
                                     super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                     ._M_engaged);
            goto LAB_0013f0c2;
          }
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
          _M_engaged = false;
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
          _25_7_ = 0;
        }
      }
      else {
        nxt.
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_engaged = false;
        nxt.
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _25_7_ = 0;
      }
      iVar8 = 1;
      unaff_R12B = 0;
    }
LAB_0013f0c2:
    optimistic_lock::read_critical_section::~read_critical_section
              ((read_critical_section *)
               &nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                ._M_engaged);
    if (iVar8 == 1) {
LAB_0013f110:
      return (bool)(unaff_R12B & 1);
    }
  }
  nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_engaged = false;
  nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>._25_7_ =
       0;
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)
             &nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
              ._M_engaged);
  unaff_R12B = 0;
  goto LAB_0013f110;
}

Assistant:

bool olc_db<Key, Value>::iterator::try_next() {
  while (!empty()) {
    const auto& e = top();
    const auto node{e.node};  // the node on the top of the stack.
    UNODB_DETAIL_ASSERT(node != nullptr);
    auto node_critical_section(
        node_ptr_lock(node).rehydrate_read_lock(e.version));
    // Restart check (fails if node was modified after it was pushed
    // onto the stack).
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return false;
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      pop();  // pop off the leaf
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      continue;        // falls through loop if just a root leaf since stack now
                       // empty.
    }
    auto* inode{node.template ptr<inode_type*>()};
    auto nxt = inode->next(node_type,
                           e.child_index);  // next child of that parent.
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) {
      // restart check
      return false;  // LCOV_EXCL_LINE
    }
    if (!nxt.has_value()) {
      pop();  // Nothing more for that inode.
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      continue;  // We will look for the right sibling of the parent inode.
    }
    // Fix up stack for new parent node state and left-most descent.
    const auto& e2 = nxt.value();
    pop();
    if (UNODB_DETAIL_UNLIKELY(!try_push(e2, node_critical_section)))
      return false;                                            // LCOV_EXCL_LINE
    auto child = inode->get_child(node_type, e2.child_index);  // descend
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))  // before using
      return false;  // LCOV_EXCL_LINE
    return try_left_most_traversal(child, node_critical_section);
  }
  return true;  // stack is empty, so iterator == end().
}